

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O2

EC_T_DWORD RasNotifyWrapper(EC_T_DWORD dwCode,EC_T_NOTIFYPARMS *pParms)

{
  void *pvVar1;
  uint *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  CAtEmLogging *pCVar7;
  uint uVar8;
  
  if (pParms == (EC_T_NOTIFYPARMS *)0x0) {
    return 0x9811000b;
  }
  uVar4 = (ulong)dwCode;
  pvVar1 = pParms->pCallerData;
  if (pvVar1 == (void *)0x0) {
    return 0x9811000b;
  }
  if (pParms == (EC_T_NOTIFYPARMS *)0x0) {
    return 0x9811000b;
  }
  switch(dwCode) {
  case 0x110001:
    if (0xf < pParms->dwInBufSize) {
      puVar2 = (uint *)pParms->pbyInBuf;
      CAtEmLogging::LogError
                (*(CAtEmLogging **)((long)pvVar1 + 8),"Marshaling error! Cookie: 0x%lx",
                 (ulong)*puVar2);
      pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
      uVar5 = puVar2[3];
      uVar3 = ecatGetText(puVar2[1]);
      CAtEmLogging::LogError
                (pCVar7,"Command: 0x%lx, Cause: %s (0x%lx)",(ulong)uVar5,uVar3,(ulong)puVar2[1]);
      CAtEmLogging::LogError
                (*(CAtEmLogging **)((long)pvVar1 + 8),"Protocol Header: 0x%lx",(ulong)puVar2[2]);
      return 0;
    }
    pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
    pcVar6 = "Invalid Parameter size for ATEMRAS_NOTIFY_MARSHALERROR";
    goto LAB_0014ce65;
  case 0x110002:
    pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
    uVar3 = ecatGetText(*(uint *)pParms->pbyInBuf);
    uVar4 = (ulong)*(uint *)pParms->pbyInBuf;
    pcVar6 = "Acknowledge error! Error: %s (0x%lx)";
LAB_0014ceed:
    CAtEmLogging::LogError(pCVar7,pcVar6,uVar3,uVar4);
    return 0;
  case 0x110003:
    uVar5 = *(uint *)pParms->pbyInBuf;
    uVar8 = *(uint *)((long)pParms->pbyInBuf + 4);
    pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
    uVar3 = ecatGetNotifyText(uVar8);
    pcVar6 = "Out of notification memory! %s (0x%08X), cookie 0x%lx.\n";
    break;
  case 0x110004:
    uVar5 = *(uint *)pParms->pbyInBuf;
    uVar8 = *(uint *)((long)pParms->pbyInBuf + 4);
    pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
    uVar3 = ecatGetNotifyText(uVar8);
    pcVar6 = "Out of non-mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n";
    break;
  case 0x110005:
    uVar5 = *(uint *)pParms->pbyInBuf;
    uVar8 = *(uint *)((long)pParms->pbyInBuf + 4);
    pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
    uVar3 = ecatGetNotifyText(uVar8);
    pcVar6 = "Out of mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n";
    break;
  default:
    if (dwCode == 0x100003) {
      if (0xf < pParms->dwInBufSize) {
        return 0;
      }
      pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
      pcVar6 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_UNREGISTER";
    }
    else if (dwCode == 0x100002) {
      if (0xf < pParms->dwInBufSize) {
        return 0;
      }
      pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
      pcVar6 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_REGISTER\n";
    }
    else {
      if (dwCode != 0x100001) {
        pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
        uVar3 = ecatGetNotifyText(dwCode);
        pcVar6 = "emRasNotify: name = %s code = 0x%x";
        goto LAB_0014ceed;
      }
      if (7 < pParms->dwInBufSize) {
        puVar2 = (uint *)pParms->pbyInBuf;
        uVar5 = *puVar2;
        pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
        if (uVar5 == 0) {
          CAtEmLogging::LogMsg(pCVar7,"RAS Connection changed: Established!\n");
          *(undefined4 *)((long)pvVar1 + 0x7744) = 0;
          return 0;
        }
        uVar3 = ecatGetText(uVar5);
        CAtEmLogging::LogMsg
                  (pCVar7,"RAS Connection changed: Cause: %s (0x%lx)\n",uVar3,(ulong)*puVar2);
        *(undefined4 *)((long)pvVar1 + 0x7744) = 1;
        return 0;
      }
      pCVar7 = *(CAtEmLogging **)((long)pvVar1 + 8);
      pcVar6 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_CONNECTION";
    }
LAB_0014ce65:
    CAtEmLogging::LogError(pCVar7,pcVar6);
    return 0x9811000b;
  }
  CAtEmLogging::LogError(pCVar7,pcVar6,uVar3,(ulong)uVar8,(ulong)uVar5);
  return 0;
}

Assistant:

static EC_T_DWORD RasNotifyWrapper(
                            EC_T_DWORD         dwCode, 
                            EC_T_NOTIFYPARMS*  pParms
                            )
{
    EC_T_DWORD                      dwRetVal                = EC_E_NOERROR;
    CEmNotification*                pNotInst                = EC_NULL;
    
    if ((EC_NULL == pParms)||(EC_NULL==pParms->pCallerData))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }
    
    pNotInst = (CEmNotification*)(pParms->pCallerData);
    dwRetVal = pNotInst->emRasNotify(dwCode, pParms);
Exit:
    
    return dwRetVal;
}